

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptBlockData.cpp
# Opt level: O2

Value * __thiscall
GlobOptBlockData::FindFuturePropertyValue(GlobOptBlockData *this,PropertySym *propertySym)

{
  OpCode OVar1;
  Instr *pIVar2;
  Opnd *this_00;
  Func *pFVar3;
  ScriptContext *scriptContext;
  code *pcVar4;
  bool bVar5;
  uint sourceContextId;
  uint functionId;
  undefined4 *puVar6;
  Value *pVVar7;
  StackSym *pSVar8;
  PropertySym *pPVar9;
  RegOpnd *pRVar10;
  SymOpnd *pSVar11;
  
  if (propertySym == (PropertySym *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar6 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                       ,0x54a,"(propertySym)","propertySym");
    if (!bVar5) {
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar6 = 0;
  }
  pVVar7 = FindValue(this,&propertySym->super_Sym);
  if (pVVar7 != (Value *)0x0) {
    return pVVar7;
  }
  sourceContextId = Func::GetSourceContextId(this->globOpt->func);
  functionId = Func::GetLocalFunctionId(this->globOpt->func);
  bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_01441eb0,CopyPropPhase,sourceContextId,functionId);
  if (bVar5) {
    return (Value *)0x0;
  }
  pSVar8 = propertySym->m_stackSym;
  pVVar7 = FindValue(this,&pSVar8->super_Sym);
  if (pVVar7 != (Value *)0x0) goto LAB_00464f43;
  pIVar2 = (pSVar8->field_5).m_instrDef;
  if ((pIVar2 != (Instr *)0x0 & pSVar8->field_0x18) != 1) {
    return (Value *)0x0;
  }
  OVar1 = pIVar2->m_opcode;
  if (((OVar1 != Ld_A) && (OVar1 != LdSlotArr)) && (OVar1 != LdSlot)) {
    return (Value *)0x0;
  }
  this_00 = pIVar2->m_src1;
  if (this_00 == (Opnd *)0x0) {
    return (Value *)0x0;
  }
  bVar5 = IR::Opnd::IsRegOpnd(this_00);
  if (bVar5) {
    pRVar10 = IR::Opnd::AsRegOpnd(this_00);
    pSVar8 = pRVar10->m_sym;
LAB_00464fe8:
    pVVar7 = FindValue(this,&pSVar8->super_Sym);
  }
  else {
    bVar5 = IR::Opnd::IsSymOpnd(this_00);
    if (!bVar5) {
      return (Value *)0x0;
    }
    pSVar11 = IR::Opnd::AsSymOpnd(this_00);
    pSVar8 = (StackSym *)pSVar11->m_sym;
    if ((pSVar8->super_Sym).m_kind == SymKindStack) goto LAB_00464fe8;
    pFVar3 = this->globOpt->func;
    if (pFVar3->m_isBackgroundJIT == false) {
      scriptContext = (ScriptContext *)pFVar3->m_scriptContextInfo;
      ThreadContext::ProbeStackNoDispose
                (scriptContext->threadContext,0xc00,scriptContext,(PVOID)0x0);
    }
    pPVar9 = Sym::AsPropertySym((Sym *)pSVar8);
    pVVar7 = FindFuturePropertyValue(this,pPVar9);
  }
  if (pVVar7 == (Value *)0x0) {
    return (Value *)0x0;
  }
LAB_00464f43:
  pSVar8 = GetCopyPropSym(this,(Sym *)0x0,pVVar7);
  if (pSVar8 == (StackSym *)0x0) {
    return (Value *)0x0;
  }
  pPVar9 = PropertySym::Find((pSVar8->super_Sym).m_id,propertySym->m_propertyId,this->globOpt->func)
  ;
  if (pPVar9 == (PropertySym *)0x0) {
    return (Value *)0x0;
  }
  pVVar7 = FindValue(this,&pPVar9->super_Sym);
  return pVVar7;
}

Assistant:

Value *
GlobOptBlockData::FindFuturePropertyValue(PropertySym *const propertySym)
{
    Assert(propertySym);

    // Try a direct lookup based on this sym
    Value *const value = this->FindValue(propertySym);
    if(value)
    {
        return value;
    }

    if(PHASE_OFF(Js::CopyPropPhase, this->globOpt->func))
    {
        // Need to use copy-prop info to backtrack
        return nullptr;
    }

    // Try to get the property object's value
    StackSym *const objectSym = propertySym->m_stackSym;
    Value *objectValue = this->FindValue(objectSym);
    if(!objectValue)
    {
        if(!objectSym->IsSingleDef())
        {
            return nullptr;
        }

        switch(objectSym->m_instrDef->m_opcode)
        {
        case Js::OpCode::Ld_A:
        case Js::OpCode::LdSlotArr:
        case Js::OpCode::LdSlot:
            // Allow only these op-codes for tracking the object sym's value transfer backwards. Other transfer op-codes
            // could be included here if this function is used in scenarios that need them.
            break;

        default:
            return nullptr;
        }

        // Try to get the property object's value from the src of the definition
        IR::Opnd *const objectTransferSrc = objectSym->m_instrDef->GetSrc1();
        if(!objectTransferSrc)
        {
            return nullptr;
        }
        if(objectTransferSrc->IsRegOpnd())
        {
            objectValue = this->FindValue(objectTransferSrc->AsRegOpnd()->m_sym);
        }
        else if(objectTransferSrc->IsSymOpnd())
        {
            Sym *const objectTransferSrcSym = objectTransferSrc->AsSymOpnd()->m_sym;
            if(objectTransferSrcSym->IsStackSym())
            {
                objectValue = this->FindValue(objectTransferSrcSym);
            }
            else
            {
                // About to make a recursive call, so when jitting in the foreground, probe the stack
                if(!this->globOpt->func->IsBackgroundJIT())
                {
                    PROBE_STACK_NO_DISPOSE(this->globOpt->func->GetScriptContext(), Js::Constants::MinStackDefault);
                }
                objectValue = FindFuturePropertyValue(objectTransferSrcSym->AsPropertySym());
            }
        }
        else
        {
            return nullptr;
        }
        if(!objectValue)
        {
            return nullptr;
        }
    }

    // Try to use the property object's copy-prop sym and the property ID to find a mapped property sym, and get its value
    StackSym *const objectCopyPropSym = this->GetCopyPropSym(nullptr, objectValue);
    if(!objectCopyPropSym)
    {
        return nullptr;
    }
    PropertySym *const propertyCopyPropSym = PropertySym::Find(objectCopyPropSym->m_id, propertySym->m_propertyId, this->globOpt->func);
    if(!propertyCopyPropSym)
    {
        return nullptr;
    }
    return this->FindValue(propertyCopyPropSym);
}